

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O0

int dwarf_get_loclist_c(Dwarf_Attribute attr,Dwarf_Loc_Head_c *ll_header_out,
                       Dwarf_Unsigned *listlen_out,Dwarf_Error *error)

{
  ushort uVar1;
  Dwarf_Bool is_dwo_00;
  Dwarf_Debug dbg_00;
  Dwarf_Debug error_00;
  int iVar2;
  char *msg;
  int leres;
  int eres;
  int ores;
  char *attrname;
  char *formname;
  dwarfstring m;
  int lkind;
  int setup_res;
  Dwarf_Bool is_dwo;
  Dwarf_Unsigned attrnum;
  ushort local_56;
  Dwarf_Bool is_cu;
  Dwarf_Half cuversionstamp;
  Dwarf_CU_Context pDStack_50;
  uint address_size;
  Dwarf_CU_Context cucontext;
  Dwarf_Loc_Head_c llhead;
  Dwarf_Debug pDStack_38;
  Dwarf_Half form;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *listlen_out_local;
  Dwarf_Loc_Head_c *ll_header_out_local;
  Dwarf_Attribute attr_local;
  
  pDStack_38 = (Dwarf_Debug)0x0;
  llhead._6_2_ = 0;
  cucontext = (Dwarf_CU_Context)0x0;
  pDStack_50 = (Dwarf_CU_Context)0x0;
  is_cu = 0;
  local_56 = 0;
  attrnum._4_4_ = 0;
  m._28_4_ = 0;
  dbg = (Dwarf_Debug)error;
  error_local = (Dwarf_Error *)listlen_out;
  listlen_out_local = (Dwarf_Unsigned *)ll_header_out;
  ll_header_out_local = (Dwarf_Loc_Head_c *)attr;
  if (attr == (Dwarf_Attribute)0x0) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x6f,
                        "DW_DLE_ATTR_NULLNULL Dwarf_Attribute argument passed to dwarf_get_loclist_c()"
                       );
    attr_local._4_4_ = 1;
  }
  else {
    pDStack_38 = attr->ar_dbg;
    if ((pDStack_38 == (Dwarf_Debug)0x0) || (pDStack_38->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_c()either null or it containsa stale Dwarf_Debug pointer"
                         );
      attr_local._4_4_ = 1;
    }
    else {
      attr_local._4_4_ =
           _dwarf_setup_loc(attr,&stack0xffffffffffffffc8,&stack0xffffffffffffffb0,
                            (Dwarf_Half *)((long)&llhead + 6),error);
      if (attr_local._4_4_ == 0) {
        uVar1 = *(ushort *)ll_header_out_local;
        local_56 = pDStack_50->cc_version_stamp;
        is_cu = (Dwarf_Bool)pDStack_50->cc_address_size;
        is_dwo_00 = pDStack_50->cc_is_dwo;
        m._28_4_ = determine_location_lkind((uint)local_56,(uint)llhead._6_2_,is_dwo_00);
        if (m._28_4_ == 99) {
          attrname = "<unknownform>";
          _eres = "<unknown attribute>";
          dwarfstring_constructor((dwarfstring_s *)&formname);
          dwarf_get_FORM_name((uint)llhead._6_2_,&attrname);
          dwarf_get_AT_name((uint)uVar1,(char **)&eres);
          dwarfstring_append_printf_u
                    ((dwarfstring *)&formname,"DW_DLE_LOC_EXPR_BAD: For Compilation Unit version %u"
                     ,(ulong)local_56);
          dwarfstring_append_printf_u((dwarfstring *)&formname,", attribute 0x%x (",(ulong)uVar1);
          dwarfstring_append((dwarfstring_s *)&formname,_eres);
          dwarfstring_append_printf_u((dwarfstring *)&formname,") form 0x%x (",(ulong)llhead._6_2_);
          dwarfstring_append((dwarfstring_s *)&formname,attrname);
          if (is_dwo_00 == 0) {
            dwarfstring_append((dwarfstring_s *)&formname,") (the CU is not a .dwo) ");
          }
          else {
            dwarfstring_append((dwarfstring_s *)&formname,") (the CU is a .dwo) ");
          }
          dwarfstring_append((dwarfstring_s *)&formname," we don\'t understand the location");
          error_00 = dbg;
          dbg_00 = pDStack_38;
          msg = dwarfstring_string((dwarfstring_s *)&formname);
          _dwarf_error_string(dbg_00,(Dwarf_Error *)error_00,0x80,msg);
          dwarfstring_destructor((dwarfstring_s *)&formname);
          attr_local._4_4_ = 1;
        }
        else {
          cucontext = (Dwarf_CU_Context)_dwarf_get_alloc(pDStack_38,';',1);
          if (cucontext == (Dwarf_CU_Context)0x0) {
            _dwarf_error(pDStack_38,(Dwarf_Error *)dbg,0x3e);
            attr_local._4_4_ = 1;
          }
          else {
            *(ushort *)&cucontext->field_0x14 = local_56;
            *(Dwarf_Half *)&cucontext->cc_debug_offset = m._28_2_;
            *(ushort *)&cucontext->cc_length_size = uVar1;
            cucontext->cc_version_stamp = llhead._6_2_;
            *(Dwarf_Debug *)&cucontext->cc_cu_die_tag = pDStack_38;
            *(Dwarf_Bool *)&cucontext->cc_abbrev_offset = is_cu;
            *(uint *)((long)&cucontext->cc_abbrev_offset + 4) = (uint)pDStack_50->cc_length_size;
            *(Dwarf_CU_Context *)&cucontext->cc_address_size = pDStack_50;
            *(unsigned_long *)((cucontext->cc_signature).signature + 6) = 0xadab4;
            *(Dwarf_Bool *)((long)(cucontext->cc_dwp_offsets).pcu_offset + 0xc) =
                 pDStack_50->cc_loclists_base_present;
            (cucontext->cc_dwp_offsets).pcu_offset[2] = pDStack_50->cc_loclists_base;
            *(Dwarf_Bool *)((cucontext->cc_dwp_offsets).pcu_offset + 3) =
                 pDStack_50->cc_low_pc_present;
            (cucontext->cc_dwp_offsets).pcu_offset[4] = pDStack_50->cc_low_pc;
            (cucontext->cc_dwp_offsets).pcu_offset[6] = pDStack_50->cc_addr_base;
            *(Dwarf_Bool *)((cucontext->cc_dwp_offsets).pcu_offset + 5) =
                 pDStack_50->cc_addr_base_present;
            if ((m._28_4_ == 1) || (m._28_4_ == 2)) {
              iVar2 = context_is_cu_not_tu(pDStack_50,(Dwarf_Bool *)((long)&attrnum + 4));
              if (iVar2 != 0) {
                dwarf_dealloc_loc_head_c((Dwarf_Loc_Head_c)cucontext);
                return 0;
              }
              iVar2 = _dwarf_original_loclist_build
                                (pDStack_38,(Dwarf_Loc_Head_c)cucontext,
                                 (Dwarf_Attribute)ll_header_out_local,(Dwarf_Error *)dbg);
              if (iVar2 != 0) {
                dwarf_dealloc_loc_head_c((Dwarf_Loc_Head_c)cucontext);
                return iVar2;
              }
              if (m._28_4_ == 1) {
                leres = cook_original_loclist_contents
                                  (pDStack_38,(Dwarf_Loc_Head_c)cucontext,(Dwarf_Error *)dbg);
              }
              else {
                leres = cook_gnu_loclist_contents
                                  (pDStack_38,(Dwarf_Loc_Head_c)cucontext,(Dwarf_Error *)dbg);
              }
              if (leres != 0) {
                dwarf_dealloc_loc_head_c((Dwarf_Loc_Head_c)cucontext);
                return leres;
              }
            }
            else if (m._28_4_ == 0) {
              iVar2 = _dwarf_original_expression_build
                                (pDStack_38,(Dwarf_Loc_Head_c)cucontext,
                                 (Dwarf_Attribute)ll_header_out_local,(Dwarf_Error *)dbg);
              if (iVar2 != 0) {
                dwarf_dealloc_loc_head_c((Dwarf_Loc_Head_c)cucontext);
                return iVar2;
              }
            }
            else if (m._28_4_ == 5) {
              iVar2 = _dwarf_loclists_fill_in_lle_head
                                (pDStack_38,(Dwarf_Attribute)ll_header_out_local,
                                 (Dwarf_Loc_Head_c)cucontext,(Dwarf_Error *)dbg);
              if (iVar2 != 0) {
                dwarf_dealloc_loc_head_c((Dwarf_Loc_Head_c)cucontext);
                return iVar2;
              }
              iVar2 = cook_loclists_contents
                                (pDStack_38,(Dwarf_Loc_Head_c)cucontext,(Dwarf_Error *)dbg);
              if (iVar2 != 0) {
                dwarf_dealloc_loc_head_c((Dwarf_Loc_Head_c)cucontext);
                return iVar2;
              }
            }
            *listlen_out_local = (Dwarf_Unsigned)cucontext;
            *error_local = (Dwarf_Error)cucontext->cc_length;
            attr_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return attr_local._4_4_;
}

Assistant:

int
dwarf_get_loclist_c(Dwarf_Attribute attr,
    Dwarf_Loc_Head_c * ll_header_out,
    Dwarf_Unsigned   * listlen_out,
    Dwarf_Error      * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Half form          = 0;
    Dwarf_Loc_Head_c llhead  = 0;
    Dwarf_CU_Context cucontext = 0;
    unsigned address_size    = 0;
    Dwarf_Half cuversionstamp       = 0;
    Dwarf_Bool is_cu         = FALSE;
    Dwarf_Unsigned attrnum   = 0;
    Dwarf_Bool is_dwo        = 0;
    int setup_res            = DW_DLV_ERROR;
    int lkind                = 0;

    if (!attr) {
        _dwarf_error_string(dbg, error,DW_DLE_ATTR_NULL,
            "DW_DLE_ATTR_NULL"
            "NULL Dwarf_Attribute "
            "argument passed to "
            "dwarf_get_loclist_c()");
        return DW_DLV_ERROR;
    }
    dbg = attr->ar_dbg;
    CHECK_DBG(dbg,error,"dwarf_get_loclist_c()");

    /* ***** BEGIN CODE ***** */
    setup_res = _dwarf_setup_loc(attr, &dbg,&cucontext, &form, error);
    if (setup_res != DW_DLV_OK) {
        return setup_res;
    }
    attrnum = attr->ar_attribute;
    cuversionstamp = cucontext->cc_version_stamp;
    address_size = cucontext->cc_address_size;
    is_dwo = cucontext->cc_is_dwo;
    lkind = determine_location_lkind(cuversionstamp,
        form, is_dwo);
    if (lkind == DW_LKIND_unknown) {
        dwarfstring m;
        const char * formname = "<unknownform>";
        const char * attrname = "<unknown attribute>";

        dwarfstring_constructor(&m);
        dwarf_get_FORM_name((unsigned int)form,&formname);
        dwarf_get_AT_name((unsigned int)attrnum,&attrname);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_LOC_EXPR_BAD: For Compilation Unit "
            "version %u",cuversionstamp);
        dwarfstring_append_printf_u(&m,
            ", attribute 0x%x (",attrnum);
        dwarfstring_append(&m,(char *)attrname);
        dwarfstring_append_printf_u(&m,
            ") form 0x%x (",form);
        dwarfstring_append(&m,(char *)formname);
        if (is_dwo) {
            dwarfstring_append(&m,") (the CU is a .dwo) ");
        } else {
            dwarfstring_append(&m,") (the CU is not a .dwo) ");
        }
        dwarfstring_append(&m," we don't understand the location");
        _dwarf_error_string(dbg,error,DW_DLE_LOC_EXPR_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    /*  Doing this early (first) to avoid repeating the alloc code
        for each type  */
    llhead = (Dwarf_Loc_Head_c)
        _dwarf_get_alloc(dbg, DW_DLA_LOC_HEAD_C, 1);
    if (!llhead) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    llhead->ll_cuversion = cuversionstamp;
    llhead->ll_lkind = lkind;
    llhead->ll_attrnum = (Dwarf_Half)attrnum;
    llhead->ll_attrform = (Dwarf_Half)form;
    llhead->ll_dbg = dbg;
    llhead->ll_address_size = address_size;
    llhead->ll_offset_size = cucontext->cc_length_size;
    llhead->ll_context = cucontext;
    llhead->ll_magic = LOCLISTS_MAGIC;

    llhead->ll_at_loclists_base_present =
        cucontext->cc_loclists_base_present;
    llhead->ll_at_loclists_base =  cucontext->cc_loclists_base;
    llhead->ll_cu_base_address_present = cucontext->cc_low_pc_present;
    llhead->ll_cu_base_address = cucontext->cc_low_pc;
    llhead->ll_cu_addr_base = cucontext->cc_addr_base;
    llhead->ll_cu_addr_base_present =
        cucontext->cc_addr_base_present;

    if (lkind == DW_LKIND_loclist ||
        lkind == DW_LKIND_GNU_exp_list) {
        int ores = 0;
        /* Here we have a loclist to deal with. */
        ores = context_is_cu_not_tu(cucontext,&is_cu);
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return setup_res;
        }
        ores = _dwarf_original_loclist_build(dbg,
            llhead, attr, error);
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return ores;
        }
        if (lkind == DW_LKIND_loclist) {
            ores = cook_original_loclist_contents(dbg,llhead,
                error);
        } else {
            ores = cook_gnu_loclist_contents(dbg,llhead,error);
        }
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return ores;
        }
    } else if (lkind == DW_LKIND_expression) {
        /* DWARF2,3,4,5 */
        int eres = 0;
        eres = _dwarf_original_expression_build(dbg,
            llhead, attr, error);
        if (eres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return eres;
        }
    } else if (lkind == DW_LKIND_loclists) {
        /* DWARF5! */
        int leres = 0;

        leres = _dwarf_loclists_fill_in_lle_head(dbg,
            attr,llhead,error);
        if (leres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return leres;
        }
        leres = cook_loclists_contents(dbg,llhead,error);
        if (leres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return leres;
        }
    } /* ASSERT else impossible */
    *ll_header_out = llhead;
    *listlen_out = llhead->ll_locdesc_count;
    return DW_DLV_OK;
}